

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedmatting.cpp
# Opt level: O1

void __thiscall SharedMatting::gathering(SharedMatting *this)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  pointer pPVar12;
  ulong uVar13;
  pointer pPVar14;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  B;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  F;
  Tuple st;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  double local_110;
  Point local_108;
  Point local_100;
  Point local_f8;
  Point local_f0;
  Point local_e8;
  Point local_e0;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_d8;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_b8;
  vector<Tuple,_std::allocator<Tuple>_> *local_a0;
  ulong local_98;
  double local_90;
  value_type local_88;
  
  local_b8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Sample(this,&local_b8,&local_d8);
  uVar8 = (uint)((ulong)((long)(this->uT).
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->uT).
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar8) {
    local_a0 = &this->tuples;
    uVar13 = 0;
    do {
      pPVar14 = (this->uT).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar1 = pPVar14[uVar13].x;
      iVar2 = pPVar14[uVar13].y;
      local_e0.x = iVar1;
      local_e0.y = iVar2;
      local_90 = pfP(this,&local_e0,
                     local_b8.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar13,
                     local_d8.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar13);
      pPVar14 = local_b8.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13].
                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pPVar14 ==
          local_b8.
          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar13].
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_12c = 0;
        local_130 = 0;
        local_134 = 0;
        local_138 = 0;
        bVar7 = false;
      }
      else {
        bVar7 = false;
        local_110 = 10000000000.0;
        local_138 = 0;
        local_134 = 0;
        local_130 = 0;
        local_12c = 0;
        local_98 = uVar13;
        do {
          uVar6 = local_98;
          iVar9 = iVar1 - pPVar14->x;
          iVar10 = iVar2 - pPVar14->y;
          dVar4 = (double)(iVar10 * iVar10 + iVar9 * iVar9);
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          for (pPVar12 = local_d8.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar6].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              pPVar12 < local_d8.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar6].
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish; pPVar12 = pPVar12 + 1) {
            local_f0.x = pPVar14->x;
            local_f0.y = pPVar14->y;
            local_f8.x = pPVar12->x;
            local_f8.y = pPVar12->y;
            local_e8.x = iVar1;
            local_e8.y = iVar2;
            dVar5 = gP(this,&local_e8,&local_f0,&local_f8,dVar4,local_90);
            if (dVar5 < local_110) {
              local_134 = pPVar14->x;
              local_138 = pPVar14->y;
              local_130 = pPVar12->x;
              local_12c = pPVar12->y;
              bVar7 = true;
              local_110 = dVar5;
            }
          }
          pPVar14 = pPVar14 + 1;
          uVar13 = local_98;
        } while (pPVar14 !=
                 local_b8.
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].
                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      local_88.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
      local_88.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      local_88.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
      local_88.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
      local_88.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
      local_88.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      local_88.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
      local_88.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
      local_88.flag = -1;
      if (bVar7) {
        puVar3 = this->data;
        lVar11 = (long)(this->channels * local_138 + this->step * local_134);
        local_88.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)puVar3[lVar11];
        local_88.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)puVar3[lVar11 + 1]
        ;
        local_88.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = (double)puVar3[lVar11 + 2]
        ;
        local_88.flag = 1;
        local_88.f.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
        lVar11 = (long)(this->channels * local_12c + this->step * local_130);
        local_88.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)puVar3[lVar11];
        local_88.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)puVar3[lVar11 + 1]
        ;
        local_88.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = (double)puVar3[lVar11 + 2]
        ;
        local_88.b.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
        local_100.x = local_134;
        local_100.y = local_138;
        local_88.sigmaf = sigma2(this,&local_100);
        local_108.x = local_130;
        local_108.y = local_12c;
        local_88.sigmab = sigma2(this,&local_108);
      }
      std::vector<Tuple,_std::allocator<Tuple>_>::push_back(local_a0,&local_88);
      this->unknownIndex[iVar1][iVar2] = (int)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar8 & 0x7fffffff));
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void SharedMatting::gathering()
{
    vector<Point> f;
    vector<Point> b;
    vector<Point>::iterator it;
    vector<Point>::iterator it1;
    vector<Point>::iterator it2;

    vector<vector<Point> > F,B;


    Sample(F, B);

    int index = 0;
    double a;
    int size = uT.size();

    for (int m = 0; m < size; ++m)
    {
        int i = uT[m].x;
        int j = uT[m].y;

        /*f.clear();
        b.clear();*/

        //sample(Point(i, j), f, b);

        /*double pfp = pfP(Point(i, j), f, b);*/

        double pfp = pfP(Point(i, j), F[m], B[m]);
        double gmin = 1.0e10;

        Point tf;
        Point tb;

        bool flag = false;
        bool first = true;

        for (it1 = F[m].begin(); it1 != F[m].end(); ++it1)
        {
            double dpf = dP(Point(i, j), *(it1));
            for (it2 = B[m].begin(); it2 < B[m].end(); ++it2)
            {

                double gp = gP(Point(i, j), *(it1), *(it2), dpf, pfp);
                if (gp < gmin)
                {
                    gmin = gp;
                    tf   = *(it1);
                    tb   = *(it2);
                    flag = true;
                }
            }
        }

        struct Tuple st;
        st.flag = -1;
        if (flag)
        {
            int bc, gc, rc;
            bc = data[tf.x * step +  tf.y * channels];
            gc = data[tf.x * step +  tf.y * channels + 1];
            rc = data[tf.x * step +  tf.y * channels + 2];
            st.flag   = 1;
            st.f      = Scalar(bc, gc, rc);
            bc = data[tb.x * step +  tb.y * channels];
            gc = data[tb.x * step +  tb.y * channels + 1];
            rc = data[tb.x * step +  tb.y * channels + 2];
            st.b      = Scalar(bc, gc, rc);
            st.sigmaf = sigma2(tf);
            st.sigmab = sigma2(tb);
        }

        tuples.push_back(st);
        unknownIndex[i][j] = index;
        ++index;
    }
    f.clear();
    b.clear();

}